

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

VisitError<typename_Visitor::ResultType> * __thiscall
Fixpp::visit<should_visit_custom_message::Visitor,should_visit_custom_message::MyVisitRules>
          (VisitError<void> *__return_storage_ptr__,Fixpp *this,size_t frame,undefined8 size)

{
  size_t *this_00;
  undefined1 *this_01;
  undefined1 local_e0 [8];
  TypedParsingContext<void> context;
  RawStreamBuf<char> streambuf;
  StreamCursor cursor;
  
  this_00 = &context.super_ParsingContext.sum;
  RawStreamBuf<char>::RawStreamBuf((RawStreamBuf<char> *)this_00,(char *)this,frame);
  this_01 = &streambuf.super_StreamBuf<char>.field_0x38;
  streambuf.super_StreamBuf<char>._56_8_ = this_00;
  StreamCursor::advance((StreamCursor *)this_01,0);
  context.super_ParsingContext.error.storage_.__data[0x28] = '\x01';
  context.super_ParsingContext.error.empty_ = false;
  context.super_ParsingContext.error._49_7_ = 0;
  context.super_ParsingContext.version.first = (char *)0x0;
  context.super_ParsingContext.bodyLength = 0;
  context.super_ParsingContext._84_4_ = 0;
  context.super_ParsingContext.msgType.first = (char *)0x0;
  context.super_ParsingContext.msgType.second = 0;
  local_e0 = (undefined1  [8])this_01;
  visitMessage<should_visit_custom_message::Visitor,should_visit_custom_message::MyVisitRules,Fixpp::TypedParsingContext<void>>
            (local_e0,size);
  TypedParsingContext<void>::toVisitError
            (__return_storage_ptr__,(TypedParsingContext<void> *)local_e0);
  std::streambuf::~streambuf((streambuf *)&context.super_ParsingContext.sum);
  return __return_storage_ptr__;
}

Assistant:

auto visit(const char* frame, size_t size, Visitor& visitor, Rules rules) -> VisitError<typename Visitor::ResultType>
    {
        static_assert(
            meta::is_detected<impl::rules::HasResultType, Visitor>::value,
            "Visitor must fulfill StaticVisitor requirement and must expose an inner ResultType type"
        );
        checkRules<Rules>();

        RawStreamBuf<> streambuf(const_cast<char *>(frame), size);
        StreamCursor cursor(&streambuf);

        using ResultType = typename Visitor::ResultType;

        TypedParsingContext<ResultType> context(cursor);
        visitMessage(context, visitor, rules);

        return context.toVisitError();
    }